

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> __thiscall
opts::Option<unsigned_int>(opts *this,char s,string *l,uint *var,string *help)

{
  OptionContainer<unsigned_int> *this_00;
  string local_50;
  
  this_00 = (OptionContainer<unsigned_int> *)operator_new(0x98);
  local_50.field_2._M_allocated_capacity = 0x44454e4749534e55;
  local_50.field_2._8_4_ = 0x544e4920;
  local_50._M_string_length = 0xc;
  local_50.field_2._M_local_buf[0xc] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  OptionContainer<unsigned_int>::OptionContainer(this_00,s,l,var,help,&local_50);
  *(OptionContainer<unsigned_int> **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<BasicOption>
Option(char s, const std::string& l, T& var, const std::string& help)       { return std::unique_ptr<BasicOption>{new OptionContainer<T>(s, l, var, help)}; }